

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::RandomFloatingGenerator
          (RandomFloatingGenerator<long_double> *this,longdouble a,longdouble b,uint32_t seed)

{
  uint32_t local_3c;
  longdouble local_38;
  longdouble local_28;
  
  local_28 = a;
  local_38 = b;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache._M_dataplus.
  _M_p = (pointer)&(this->super_IGenerator<long_double>).super_GeneratorUntypedBase.
                   m_stringReprCache.field_2;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache.
  _M_string_length = 0;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_stringReprCache.field_2.
  _M_local_buf[0] = '\0';
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase.m_currentElementIndex = 0;
  (this->super_IGenerator<long_double>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_001a4428;
  local_3c = seed;
  Catch::Detail::
  make_unique<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl,long_double&,long_double&,unsigned_int&>
            ((Detail *)&this->m_pimpl,&local_28,&local_38,&local_3c);
  next(this);
  return;
}

Assistant:

RandomFloatingGenerator<long double>::RandomFloatingGenerator(
            long double a, long double b, std::uint32_t seed) :
            m_pimpl(Catch::Detail::make_unique<PImpl>(a, b, seed)) {
            static_cast<void>( next() );
        }